

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::insert
          (iterator *this,unsigned_long left,unsigned_long right,monostate *value,
          allocator_type *alloc)

{
  IndexPair offset_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  IndexPair IVar4;
  interval<unsigned_long> *key;
  uint32_t *puVar5;
  long *in_RDI;
  uint32_t size;
  allocator_type *in_stack_00000040;
  IndexPair offset;
  uint32_t size_1;
  interval<unsigned_long> ival;
  Path *path;
  IntervalMap<unsigned_long,_std::monostate,_3U> *map;
  allocator_type *in_stack_ffffffffffffff68;
  const_iterator *in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  Path *in_stack_ffffffffffffff80;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *in_stack_ffffffffffffff88;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *pLVar6;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  
  pLVar6 = (LeafNode<unsigned_long,_std::monostate,_11U,_false> *)*in_RDI;
  bVar1 = IntervalMap<unsigned_long,_std::monostate,_3U>::const_iterator::isFlat
                    (in_stack_ffffffffffffff70);
  uVar3 = (uint32_t)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    in_stack_ffffffffffffff90 = pLVar6;
    IntervalMapDetails::Path::leafOffset((Path *)0xb0dce6);
    uVar2 = IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_3U,_true>::insertFrom
                      ((LeafNode<unsigned_long,_std::monostate,_3U,_true> *)
                       in_stack_ffffffffffffff88,
                       (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (uint32_t)in_stack_ffffffffffffff80,
                       (interval<unsigned_long> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (monostate *)in_stack_ffffffffffffff70);
    if (uVar2 < 4) {
      *(uint32_t *)
       ((long)((pLVar6->
               super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
               ).first + 3) + 0xc) = uVar2;
      IntervalMapDetails::Path::setSize
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      return;
    }
    IntervalMapDetails::Path::leafOffset((Path *)0xb0dd44);
    IVar4 = switchToBranch((IntervalMap<unsigned_long,_std::monostate,_3U> *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           in_stack_ffffffffffffff68);
    offset_00.second = uVar2;
    offset_00.first = IVar4.second;
    IntervalMapDetails::Path::
    replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,2u,true>>
              ((Path *)CONCAT44(IVar4.first,IVar4.second),
               (BranchNode<unsigned_long,_2U,_true> *)
               CONCAT44(IVar4.first,in_stack_ffffffffffffffa0),uVar3,offset_00);
    in_stack_ffffffffffffff88 = pLVar6;
  }
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  bVar1 = IntervalMapDetails::Path::valid(in_stack_ffffffffffffff80);
  if (!bVar1) {
    IntervalMapDetails::Path::legalizeForInsert((Path *)in_stack_ffffffffffffff70,uVar3);
  }
  IntervalMapDetails::Path::leafSize((Path *)0xb0ddad);
  key = (interval<unsigned_long> *)
        IntervalMapDetails::Path::
        leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                  ((Path *)0xb0ddbb);
  IntervalMapDetails::Path::leafOffset((Path *)0xb0ddca);
  uVar3 = IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>::insertFrom
                    (in_stack_ffffffffffffff88,(uint32_t)((ulong)key >> 0x20),(uint32_t)key,
                     (interval<unsigned_long> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (monostate *)in_stack_ffffffffffffff70);
  if (0xb < uVar3) {
    IntervalMapDetails::Path::height((Path *)in_stack_ffffffffffffff70);
    IntervalMap<unsigned_long,std::monostate,3u>::iterator::
    overflow<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
              ((iterator *)ival.left,size_1,in_stack_00000040);
    in_stack_ffffffffffffff70 =
         (const_iterator *)
         IntervalMapDetails::Path::
         leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                   ((Path *)0xb0de14);
    puVar5 = IntervalMapDetails::Path::leafOffset((Path *)0xb0de23);
    in_stack_ffffffffffffff7c = *puVar5;
    IntervalMapDetails::Path::leafSize((Path *)0xb0de33);
    IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>::insertFrom
              (in_stack_ffffffffffffff88,(uint32_t)((ulong)key >> 0x20),(uint32_t)key,
               (interval<unsigned_long> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (monostate *)in_stack_ffffffffffffff70);
  }
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  IntervalMapDetails::Path::height((Path *)in_stack_ffffffffffffff70);
  IntervalMapDetails::Path::setSize((Path *)key,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
  ;
  IntervalMapDetails::Path::height((Path *)in_stack_ffffffffffffff70);
  updateParentBounds((iterator *)in_stack_ffffffffffffff90,uVar3,key);
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::insert(TKey left, TKey right, const TValue& value,
                                                    allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;

    interval<TKey> ival{left, right};
    if (this->isFlat()) {
        // Try simple root leaf insert first.
        uint32_t size = map.rootLeaf.insertFrom(path.leafOffset(), map.rootSize, ival, value);
        if (size <= RootLeaf::Capacity) {
            map.rootSize = size;
            path.setSize(0, size);
            return;
        }

        // Root is full, we need to branch.
        auto offset = map.switchToBranch(path.leafOffset(), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, offset);
    }

    if (!path.valid())
        path.legalizeForInsert(this->map->height);

    uint32_t size = path.leafSize();
    size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), size, ival, value);

    if (size > Leaf::Capacity) {
        // If the new element didn't fit, overflow the node and try again.
        overflow<Leaf>(path.height(), alloc);
        size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), path.leafSize(), ival,
                                                     value);
    }

    // Update path to match the newly inserted element.
    path.setSize(path.height(), size);
    updateParentBounds(path.height(), ival);
}